

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_string_cursor_to_index(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp offset)

{
  undefined1 auVar1 [16];
  long lVar2;
  sexp_uint_t sVar3;
  sexp in_RCX;
  uchar *in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  ulong in_R8;
  sexp_sint_t off;
  sexp in_stack_00000038;
  char *in_stack_00000040;
  sexp in_stack_00000048;
  sexp in_stack_00000050;
  sexp local_8;
  
  auVar1._8_8_ = (long)in_R8 >> 0x3f;
  auVar1._0_8_ = in_R8 & 0xfffffffffffffffd;
  lVar2 = SUB168(auVar1 / SEXT816(8),0);
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
    if ((in_R8 & 7) == 2) {
      if ((lVar2 < 0) || ((in_RCX->value).uvector.length < lVar2)) {
        local_8 = sexp_user_exception(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                                      in_stack_00000038);
      }
      else {
        sVar3 = sexp_string_utf8_length(in_RDX,(long)in_RCX);
        local_8 = (sexp)(sVar3 << 1 | 1);
      }
    }
    else {
      local_8 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDI,in_RSI,(sexp_uint_t)in_RDX,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_string_cursor_to_index (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp offset) {
  sexp_sint_t off = sexp_unbox_string_cursor(offset);
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, offset);
  if (off < 0 || off > (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-cursor->index: offset out of range", offset);
#if SEXP_USE_STRING_REF_CACHE
  sexp_uint_t cached_idx = sexp_cached_char_idx(str);
  sexp_sint_t cached_off = sexp_unbox_string_cursor(sexp_cached_cursor(str));
  unsigned char* string_data = (unsigned char*)sexp_string_data(str);
  sexp_sint_t idx_delta;
  if (off >= cached_off) {
    idx_delta = sexp_string_utf8_length(string_data+cached_off, off-cached_off);
  } else {
    idx_delta = 0 - sexp_string_utf8_length(string_data+off, cached_off-off);
  }

  sexp_uint_t new_idx = cached_idx + idx_delta;
  sexp_cached_char_idx(str) = new_idx;
  sexp_cached_cursor(str) = offset;
  return sexp_make_fixnum(new_idx);
#else
  return sexp_make_fixnum(sexp_string_utf8_length((unsigned char*)sexp_string_data(str), off));
#endif
}